

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

WebPMux * DuplicateMuxHeader(WebPMux *mux)

{
  FILE *__stream;
  WebPMuxError WVar1;
  char *pcVar2;
  WebPData metadata;
  int ok;
  int i;
  WebPMuxError err;
  WebPMuxAnimParams p;
  WebPMux *new_mux;
  int in_stack_ffffffffffffffc4;
  WebPData *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffdc;
  WebPMux *local_18;
  
  local_18 = WebPMuxNew();
  iVar3 = 1;
  if (local_18 == (WebPMux *)0x0) {
    return (WebPMux *)0x0;
  }
  WVar1 = WebPMuxGetAnimationParams
                    ((WebPMux *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (WebPMuxAnimParams *)CONCAT44(1,in_stack_ffffffffffffffd0));
  if (WVar1 == WEBP_MUX_OK) {
    WVar1 = WebPMuxSetAnimationParams
                      ((WebPMux *)CONCAT44(1,in_stack_ffffffffffffffd8),
                       (WebPMuxAnimParams *)CONCAT44(iVar3,in_stack_ffffffffffffffd0));
    __stream = _stderr;
    if (WVar1 != WEBP_MUX_OK) {
      pcVar2 = ErrorString(WVar1);
      fprintf(__stream,"Error (%s) handling animation params.\n",pcVar2);
      iVar3 = 0;
      goto LAB_001054f2;
    }
    WVar1 = WEBP_MUX_OK;
  }
  for (iVar4 = 1; iVar4 < 4; iVar4 = iVar4 + 1) {
    WVar1 = WebPMuxGetChunk((WebPMux *)CONCAT44(WVar1,iVar4),
                            (char *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
    if ((WVar1 == WEBP_MUX_OK) && (in_stack_ffffffffffffffc8 != (WebPData *)0x0)) {
      WVar1 = WebPMuxSetChunk((WebPMux *)CONCAT44(1,iVar4),
                              (char *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
      if (WVar1 != WEBP_MUX_OK) {
        fprintf(_stderr,"Error transferring metadata in DuplicateMuxHeader().");
        iVar3 = 0;
        break;
      }
      WVar1 = WEBP_MUX_OK;
    }
  }
LAB_001054f2:
  if (iVar3 == 0) {
    WebPMuxDelete((WebPMux *)0x105503);
    local_18 = (WebPMux *)0x0;
  }
  return local_18;
}

Assistant:

static WebPMux* DuplicateMuxHeader(const WebPMux* const mux) {
  WebPMux* new_mux = WebPMuxNew();
  WebPMuxAnimParams p;
  WebPMuxError err;
  int i;
  int ok = 1;

  if (new_mux == NULL) return NULL;

  err = WebPMuxGetAnimationParams(mux, &p);
  if (err == WEBP_MUX_OK) {
    err = WebPMuxSetAnimationParams(new_mux, &p);
    if (err != WEBP_MUX_OK) {
      ERROR_GOTO2("Error (%s) handling animation params.\n",
                  ErrorString(err), End);
    }
  } else {
    /* it might not be an animation. Just keep moving. */
  }

  for (i = 1; i <= 3; ++i) {
    WebPData metadata;
    err = WebPMuxGetChunk(mux, kFourccList[i], &metadata);
    if (err == WEBP_MUX_OK && metadata.size > 0) {
      err = WebPMuxSetChunk(new_mux, kFourccList[i], &metadata, 1);
      if (err != WEBP_MUX_OK) {
        ERROR_GOTO1("Error transferring metadata in DuplicateMuxHeader().",
                    End);
      }
    }
  }

 End:
  if (!ok) {
    WebPMuxDelete(new_mux);
    new_mux = NULL;
  }
  return new_mux;
}